

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void determine_constants_arrays(Context *ctx)

{
  long *plVar1;
  uint uVar2;
  ConstantsList *pCVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  void *pvVar7;
  MOJOSHADER_malloc p_Var8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  VariableList *pVVar12;
  ConstantsList **ppCVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 *puVar16;
  int iVar17;
  int iVar18;
  long alStack_50 [3];
  int local_34;
  
  if (ctx->determined_constants_arrays == 0) {
    ctx->determined_constants_arrays = 1;
    uVar2 = ctx->constant_count;
    uVar11 = (ulong)uVar2;
    if (1 < (int)uVar2) {
      lVar9 = -(uVar11 * 8 + 0x17 & 0xfffffffffffffff0);
      puVar16 = (undefined8 *)((long)alStack_50 + lVar9 + 8);
      ppCVar13 = &ctx->constants;
      uVar14 = 0;
      do {
        pCVar3 = *ppCVar13;
        if (pCVar3 == (ConstantsList *)0x0) {
          failf(ctx,"%s","BUG: mismatched constant list and count");
          return;
        }
        puVar16[uVar14] = pCVar3;
        ppCVar13 = &pCVar3->next;
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
      puVar16[uVar11] = 0;
      do {
        bVar10 = true;
        uVar14 = 0;
        do {
          lVar4 = puVar16[uVar14];
          lVar5 = *(long *)((long)alStack_50 + uVar14 * 8 + lVar9 + 0x10);
          if (*(int *)(lVar5 + 4) < *(int *)(lVar4 + 4)) {
            puVar16[uVar14] = lVar5;
            *(long *)((long)alStack_50 + uVar14 * 8 + lVar9 + 0x10) = lVar4;
            bVar10 = false;
          }
          uVar14 = uVar14 + 1;
        } while (uVar2 - 1 != uVar14);
      } while (!bVar10);
      uVar14 = 0;
      do {
        plVar1 = puVar16 + uVar14;
        lVar4 = uVar14 * 8;
        uVar14 = uVar14 + 1;
        *(undefined8 *)(*plVar1 + 0x18) = *(undefined8 *)((long)alStack_50 + lVar4 + lVar9 + 0x10);
      } while (uVar11 != uVar14);
      ctx->constants = (ConstantsList *)*puVar16;
      uVar11 = (ulong)(uVar2 + 1);
      uVar15 = 0xffffffff;
      uVar14 = 0;
      local_34 = 0;
      iVar17 = -1;
      alStack_50[2] = uVar11;
      do {
        piVar6 = (int *)puVar16[uVar14];
        if ((piVar6 == (int *)0x0) || (*piVar6 == 0)) {
          iVar18 = (int)uVar14;
          if (iVar17 != -1) {
            if ((piVar6 == (int *)0x0) || (piVar6[1] != *(int *)(puVar16[(int)uVar15] + 4) + 1)) {
              if (0 < local_34) {
                pvVar7 = ctx->malloc_data;
                p_Var8 = ctx->malloc;
                *(undefined8 *)((long)alStack_50 + lVar9) = 0x11cb8c;
                pVVar12 = (VariableList *)(*p_Var8)(0x28,pvVar7);
                if (pVVar12 == (VariableList *)0x0) {
                  ctx->isfail = 1;
                  ctx->out_of_memory = 1;
                  return;
                }
                pVVar12->type = MOJOSHADER_UNIFORM_FLOAT;
                pCVar3 = (ConstantsList *)puVar16[iVar17];
                iVar17 = (pCVar3->constant).index;
                pVVar12->index = iVar17;
                pVVar12->count = (*(int *)(puVar16[(int)uVar15] + 4) - iVar17) + 1;
                pVVar12->constant = pCVar3;
                pVVar12->used = 0;
                pVVar12->emit_position = -1;
                pVVar12->next = ctx->variables;
                ctx->variables = pVVar12;
                uVar11 = alStack_50[2];
              }
            }
            else {
              local_34 = local_34 + 1;
              iVar18 = iVar17;
            }
          }
          uVar15 = uVar14 & 0xffffffff;
          iVar17 = iVar18;
        }
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
    }
  }
  return;
}

Assistant:

static void determine_constants_arrays(Context *ctx)
{
    // Only process this stuff once. This is called after all DEF* opcodes
    //  could have been parsed.
    if (ctx->determined_constants_arrays)
        return;

    ctx->determined_constants_arrays = 1;

    if (ctx->constant_count <= 1)
        return;  // nothing to sort or group.

    // Sort the linked list into an array for easier tapdancing...
    ConstantsList **array = (ConstantsList **) alloca(sizeof (ConstantsList *) * (ctx->constant_count + 1));
    ConstantsList *item = ctx->constants;
    int i;

    for (i = 0; i < ctx->constant_count; i++)
    {
        if (item == NULL)
        {
            fail(ctx, "BUG: mismatched constant list and count");
            return;
        } // if

        array[i] = item;
        item = item->next;
    } // for

    array[ctx->constant_count] = NULL;

    // bubble sort ftw.
    int sorted;
    do
    {
        sorted = 1;
        for (i = 0; i < ctx->constant_count-1; i++)
        {
            if (array[i]->constant.index > array[i+1]->constant.index)
            {
                ConstantsList *tmp = array[i];
                array[i] = array[i+1];
                array[i+1] = tmp;
                sorted = 0;
            } // if
        } // for
    } while (!sorted);

    // okay, sorted. While we're here, let's redo the linked list in order...
    for (i = 0; i < ctx->constant_count; i++)
        array[i]->next = array[i+1];
    ctx->constants = array[0];

    // now figure out the groupings of constants and add to ctx->variables...
    int start = -1;
    int prev = -1;
    int count = 0;
    const int hi = ctx->constant_count;
    for (i = 0; i <= hi; i++)
    {
        if (array[i] && (array[i]->constant.type != MOJOSHADER_UNIFORM_FLOAT))
            continue;  // we only care about REG_TYPE_CONST for array groups.

        if (start == -1)
        {
            prev = start = i;  // first REG_TYPE_CONST we've seen. Mark it!
            continue;
        } // if

        // not a match (or last item in the array)...see if we had a
        //  contiguous set before this point...
        if ( (array[i]) && (array[i]->constant.index == (array[prev]->constant.index + 1)) )
            count++;
        else
        {
            if (count > 0)  // multiple constants in the set?
            {
                VariableList *var;
                var = (VariableList *) Malloc(ctx, sizeof (VariableList));
                if (var == NULL)
                    break;

                var->type = MOJOSHADER_UNIFORM_FLOAT;
                var->index = array[start]->constant.index;
                var->count = (array[prev]->constant.index - var->index) + 1;
                var->constant = array[start];
                var->used = 0;
                var->emit_position = -1;
                var->next = ctx->variables;
                ctx->variables = var;
            } // else

            start = i;   // set this as new start of sequence.
        } // if

        prev = i;
    } // for
}